

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::addItem(QFormLayout *this,QLayoutItem *item)

{
  QFormLayoutPrivate *this_00;
  long *in_RDI;
  QLayoutItem *unaff_retaddr;
  ItemRole in_stack_00000008;
  int in_stack_0000000c;
  QFormLayoutPrivate *in_stack_00000010;
  int row;
  QFormLayoutPrivate *d;
  int in_stack_ffffffffffffffcc;
  
  this_00 = d_func((QFormLayout *)0x4b6a81);
  QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::rowCount
            ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)0x4b6aa1);
  QFormLayoutPrivate::insertRow(this_00,in_stack_ffffffffffffffcc);
  QFormLayoutPrivate::setItem(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
  (**(code **)(*in_RDI + 0x70))();
  return;
}

Assistant:

void QFormLayout::addItem(QLayoutItem *item)
{
    Q_D(QFormLayout);

    int row = d->insertRow(d->m_matrix.rowCount());
    d->setItem(row, FieldRole, item);
    invalidate();
}